

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

int __thiscall Epanet::Project::openReport(Project *this,char *fname)

{
  char cVar1;
  bool bVar2;
  FileError *this_00;
  undefined1 local_58 [8];
  string s;
  ReportWriter rw;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ofstream::close();
  }
  std::__cxx11::string::string((string *)local_58,fname,(allocator *)(s.field_2._M_local_buf + 8));
  if ((s._M_dataplus._M_p == (pointer)(this->inpFileName)._M_string_length) &&
     (bVar2 = Utilities::match((string *)local_58,&this->inpFileName), bVar2)) {
    this_00 = (FileError *)__cxa_allocate_exception(0x30);
    FileError::FileError(this_00,0);
  }
  else if ((s._M_dataplus._M_p == (pointer)(this->outFileName)._M_string_length) &&
          (bVar2 = Utilities::match((string *)local_58,&this->outFileName), bVar2)) {
    this_00 = (FileError *)__cxa_allocate_exception(0x30);
    FileError::FileError(this_00,0);
  }
  else {
    std::ofstream::open((char *)&this->rptFile,(_Ios_Openmode)fname);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      ReportWriter::ReportWriter
                ((ReportWriter *)((long)&s.field_2 + 8),&this->rptFile,&this->network);
      ReportWriter::writeHeading((ReportWriter *)((long)&s.field_2 + 8));
      ReportWriter::~ReportWriter((ReportWriter *)((long)&s.field_2 + 8));
      if (local_58 != (undefined1  [8])&s._M_string_length) {
        operator_delete((void *)local_58);
      }
      return 0;
    }
    this_00 = (FileError *)__cxa_allocate_exception(0x30);
    FileError::FileError(this_00,2);
  }
  __cxa_throw(this_00,&FileError::typeinfo,ENerror::~ENerror);
}

Assistant:

int  Project::openReport(const char* fname)
    {
        try
        {
            //... close an already opened report file
            if ( rptFile.is_open() ) closeReport();

           // ... check that file name is different from input file name
            string s = fname;
            if ( s.size() == inpFileName.size() && Utilities::match(s, inpFileName) )
            {
                throw FileError(FileError::DUPLICATE_FILE_NAMES);
            }
            if ( s.size() == outFileName.size() && Utilities::match(s, outFileName) )
            {
                throw FileError(FileError::DUPLICATE_FILE_NAMES);
            }

            // ... open the report file
            rptFile.open(fname);
            if ( !rptFile.is_open() )
            {
                throw FileError(FileError::CANNOT_OPEN_REPORT_FILE);
            }
            ReportWriter rw(rptFile, &network);
            rw.writeHeading();
            return 0;
        }
        catch (ENerror const& e)
        {
            writeMsg(e.msg);
            return e.code;
        }
    }